

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

void __thiscall
Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
          (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *obj)

{
  uint uVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  this->_capacityIndex = 0;
  this->_capacity = 0;
  *(undefined8 *)&this->_nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&this->_entries + 4) = 0;
  *(undefined4 *)((long)&this->_afterLast + 4) = 0;
  pEVar2 = obj->_afterLast;
  if (obj->_entries != pEVar2) {
    uVar1 = obj->_timestamp;
    pEVar3 = obj->_entries;
    do {
      pEVar4 = pEVar3 + 1;
      if (((pEVar3->field_0)._infoData & 1U) == 0 && (uint)(pEVar3->field_0)._infoData >> 2 == uVar1
         ) {
        insert(this,pEVar3->_key,(TermList)(pEVar3->_val)._content);
      }
      pEVar3 = pEVar4;
    } while (pEVar4 != pEVar2);
  }
  return;
}

Assistant:

DHMap(const DHMap& obj)
  : _timestamp(1), _size(0), _deleted(0), _capacityIndex(0), _capacity(0),
  _nextExpansionOccupancy(0), _entries(0), _afterLast(0)
  {
    typename DHMap::IteratorBase iit(obj);
    while(iit.hasNext()) {
      auto e = iit.next();
      ALWAYS(insert(e->_key,e->_val));
    }
  }